

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

ON_NurbsCage * __thiscall ON_NurbsCage::operator=(ON_NurbsCage *this,ON_BezierCage *src)

{
  bool bVar1;
  double *__src;
  int iVar2;
  int i;
  int iVar3;
  int j;
  
  bVar1 = Create(this,src->m_dim,src->m_is_rat,src->m_order[0],src->m_order[1],src->m_order[2],
                 src->m_order[0],src->m_order[1],src->m_order[2]);
  if (bVar1) {
    iVar2 = this->m_cv_count[0];
    if (0 < iVar2) {
      iVar3 = this->m_cv_count[1];
      i = 0;
      do {
        if (0 < iVar3) {
          iVar2 = this->m_cv_count[2];
          j = 0;
          do {
            if (0 < iVar2) {
              iVar3 = 0;
              do {
                __src = ON_BezierCage::CV(src,i,j,iVar3);
                if (this->m_cv != (double *)0x0) {
                  memcpy(this->m_cv +
                         (long)this->m_cv_stride[0] * (long)i +
                         (long)this->m_cv_stride[1] * (long)j +
                         (long)iVar3 * (long)this->m_cv_stride[2],__src,
                         ((long)this->m_dim + (ulong)this->m_is_rat) * 8);
                }
                iVar3 = iVar3 + 1;
                iVar2 = this->m_cv_count[2];
              } while (iVar3 < iVar2);
              iVar3 = this->m_cv_count[1];
            }
            j = j + 1;
          } while (j < iVar3);
          iVar2 = this->m_cv_count[0];
        }
        i = i + 1;
      } while (i < iVar2);
    }
  }
  return this;
}

Assistant:

ON_NurbsCage& ON_NurbsCage::operator=( const ON_BezierCage& src )
{
  if ( Create(src.m_dim,src.m_is_rat,
              src.m_order[0],src.m_order[1],src.m_order[2],
              src.m_order[0],src.m_order[1],src.m_order[2]) )
  {
    int i,j,k;
    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      for ( j = 0; j < m_cv_count[1]; j++ )
      {
        for ( k = 0; k < m_cv_count[2]; k++ )
        {
          SetCV(i,j,k,ON::intrinsic_point_style,src.CV(i,j,k));
        }           
      }
    }
  }
  return *this;
}